

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Gia_VtaPrintMemory(Vta_Man_t *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double memOth;
  double memMap;
  double memPro;
  double memSat;
  double memAig;
  double memTot;
  Vta_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  lVar2 = (long)iVar1 * 0xc;
  auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar11._0_8_ = lVar2;
  auVar11._12_4_ = 0x45300000;
  dVar5 = (auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  dVar6 = sat_solver2_memory(p->pSat,1);
  dVar7 = sat_solver2_memory_proof(p->pSat);
  lVar2 = (long)p->nObjsAlloc * 0x10 + (long)p->nBins * 4;
  auVar12._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar12._0_8_ = lVar2;
  auVar12._12_4_ = 0x45300000;
  dVar8 = (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  iVar1 = Vec_IntCap(p->vOrder);
  lVar2 = (long)iVar1 << 2;
  auVar14._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar14._0_8_ = lVar2;
  auVar14._12_4_ = 0x45300000;
  dVar9 = Vec_VecMemoryInt((Vec_Vec_t *)p->vFrames);
  iVar1 = Vec_BitCap(p->vSeenGla);
  lVar3 = (long)iVar1 << 2;
  auVar15._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar15._0_8_ = lVar3;
  auVar15._12_4_ = 0x45300000;
  dVar10 = Vec_VecMemoryInt((Vec_Vec_t *)p->vCores);
  iVar1 = Vec_IntCap(p->vAddedNew);
  lVar4 = (long)iVar1 << 2;
  auVar13._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar13._0_8_ = lVar4;
  auVar13._12_4_ = 0x45300000;
  dVar9 = (auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) +
          (auVar14._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) + 168.0 + dVar9 +
          (auVar15._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) + dVar10;
  dVar10 = dVar5 + dVar6 + dVar7 + dVar8 + dVar9;
  Abc_Print(1,"%s =","Memory: AIG     ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_70 = (dVar5 * 100.0) / dVar10;
  }
  else {
    local_70 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar5 * 1.0) / 1048576.0,local_70);
  Abc_Print(1,"%s =","Memory: SAT     ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_80 = (dVar6 * 100.0) / dVar10;
  }
  else {
    local_80 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar6 * 1.0) / 1048576.0,local_80);
  Abc_Print(1,"%s =","Memory: Proof   ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_90 = (dVar7 * 100.0) / dVar10;
  }
  else {
    local_90 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar7 * 1.0) / 1048576.0,local_90);
  Abc_Print(1,"%s =","Memory: Map     ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_a0 = (dVar8 * 100.0) / dVar10;
  }
  else {
    local_a0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar8 * 1.0) / 1048576.0,local_a0);
  Abc_Print(1,"%s =","Memory: Other   ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_b0 = (dVar9 * 100.0) / dVar10;
  }
  else {
    local_b0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar9 * 1.0) / 1048576.0,local_b0);
  Abc_Print(1,"%s =","Memory: TOTAL   ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_c0 = (dVar10 * 100.0) / dVar10;
  }
  else {
    local_c0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar10 * 1.0) / 1048576.0,local_c0);
  return;
}

Assistant:

void Gia_VtaPrintMemory( Vta_Man_t * p )
{
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjsAlloc * sizeof(Vta_Obj_t) + p->nBins * sizeof(int);
    double memOth = sizeof(Vta_Man_t);
    memOth += Vec_IntCap(p->vOrder) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vFrames );
    memOth += Vec_BitCap(p->vSeenGla) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCores );
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memOth;
    ABC_PRMP( "Memory: AIG     ", memAig, memTot );
    ABC_PRMP( "Memory: SAT     ", memSat, memTot );
    ABC_PRMP( "Memory: Proof   ", memPro, memTot );
    ABC_PRMP( "Memory: Map     ", memMap, memTot );
    ABC_PRMP( "Memory: Other   ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL   ", memTot, memTot );
}